

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownwriter.cpp
# Opt level: O0

ListInfo __thiscall QTextMarkdownWriter::listInfo(QTextMarkdownWriter *this,QTextList *list)

{
  bool bVar1;
  int iVar2;
  QDebug *pQVar3;
  QTextList *pQVar4;
  ListInfo *defaultValue;
  QTextBlock *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  ListInfo info;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QTextBlock next;
  QTextBlock last;
  QTextBlock first;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffe90;
  QString *in_stack_fffffffffffffe98;
  QTextBlock *in_stack_fffffffffffffea0;
  QTextList *in_stack_fffffffffffffea8;
  QTextBlock *this_00;
  QTextBlock *in_stack_fffffffffffffeb8;
  undefined1 local_131 [9];
  char *in_stack_fffffffffffffed8;
  QDebug local_e0 [8];
  QDebug local_a0;
  QDebug local_98;
  QDebug local_90;
  QDebug local_88;
  QDebug local_80;
  QTextBlock *local_78;
  undefined1 local_69;
  QTextBlock local_68;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = in_RSI;
  bVar1 = QMap<QTextList_*,_QTextMarkdownWriter::ListInfo>::contains
                    ((QMap<QTextList_*,_QTextMarkdownWriter::ListInfo> *)in_stack_fffffffffffffea0,
                     (QTextList **)in_stack_fffffffffffffe98);
  if (bVar1) {
    defaultValue = (ListInfo *)(in_RDI + 0x10);
    memset(local_131,0,1);
    local_69 = QMap<QTextList_*,_QTextMarkdownWriter::ListInfo>::value
                         ((QMap<QTextList_*,_QTextMarkdownWriter::ListInfo> *)
                          in_stack_fffffffffffffea0,(QTextList **)in_stack_fffffffffffffe98,
                          defaultValue);
  }
  else {
    local_69 = false;
    iVar2 = QTextList::count((QTextList *)in_stack_fffffffffffffe90);
    if (1 < iVar2) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QTextList::item(in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextList::count((QTextList *)in_stack_fffffffffffffe90);
      QTextList::item((QTextList *)local_78,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::next(local_78);
      this_00 = local_78;
LAB_00a1ce9e:
      bVar1 = QTextBlock::isValid((QTextBlock *)in_stack_fffffffffffffe90);
      if ((bVar1) &&
         (bVar1 = QTextBlock::operator==((QTextBlock *)local_38,(QTextBlock *)local_28), !bVar1)) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        lcMDW();
        anon_unknown.dwarf_1af7210::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  (in_stack_fffffffffffffe90,
                   (QLoggingCategory *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88)
                  );
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_48), bVar1) {
          anon_unknown.dwarf_1af7210::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa1cf2a);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,
                     (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                     (char *)0xa1cf43);
          QMessageLogger::debug();
          pQVar3 = QDebug::operator<<((QDebug *)this_00,in_stack_fffffffffffffed8);
          QDebug::QDebug(&local_98,pQVar3);
          ::operator<<((Stream *)&local_90,(QObject *)&local_98);
          QTextBlock::text(in_stack_fffffffffffffeb8);
          QDebug::operator<<((QDebug *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          pQVar3 = QDebug::operator<<((QDebug *)this_00,in_stack_fffffffffffffed8);
          QDebug::QDebug(&local_88,pQVar3);
          QTextBlock::textList(in_stack_fffffffffffffea0);
          ::operator<<((Stream *)&local_80,(QObject *)&local_88);
          QDebug::~QDebug(&local_80);
          QDebug::~QDebug(&local_88);
          QString::~QString((QString *)0xa1d02e);
          QDebug::~QDebug(&local_90);
          QDebug::~QDebug(&local_98);
          QDebug::~QDebug(&local_a0);
          local_40 = (undefined1 *)((ulong)local_40 & 0xffffffffffffff00);
        }
        pQVar4 = QTextBlock::textList(in_stack_fffffffffffffea0);
        if (pQVar4 != (QTextList *)0x0) goto LAB_00a1d19e;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        lcMDW();
        anon_unknown.dwarf_1af7210::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  (in_stack_fffffffffffffe90,
                   (QLoggingCategory *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88)
                  );
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_58), bVar1) {
          anon_unknown.dwarf_1af7210::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa1d0cf);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,
                     (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                     (char *)0xa1d0e5);
          QMessageLogger::debug();
          in_stack_fffffffffffffe98 =
               (QString *)QDebug::operator<<((QDebug *)this_00,in_stack_fffffffffffffed8);
          QTextBlock::text(in_stack_fffffffffffffeb8);
          QDebug::operator<<((QDebug *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          in_stack_fffffffffffffea0 =
               (QTextBlock *)QDebug::operator<<((QDebug *)this_00,in_stack_fffffffffffffed8);
          QTextBlock::text(in_stack_fffffffffffffeb8);
          QDebug::operator<<((QDebug *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          QString::~QString((QString *)0xa1d170);
          QString::~QString((QString *)0xa1d17a);
          QDebug::~QDebug(local_e0);
          local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
        }
        local_69 = true;
      }
    }
    QMap<QTextList_*,_QTextMarkdownWriter::ListInfo>::insert
              ((QMap<QTextList_*,_QTextMarkdownWriter::ListInfo> *)in_stack_fffffffffffffea0,
               (QTextList **)in_stack_fffffffffffffe98,(ListInfo *)in_stack_fffffffffffffe90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (ListInfo)local_69;
LAB_00a1d19e:
  QTextBlock::next(this_00);
  QTextBlock::operator=((QTextBlock *)local_38,&local_68);
  goto LAB_00a1ce9e;
}

Assistant:

QTextMarkdownWriter::ListInfo QTextMarkdownWriter::listInfo(QTextList *list)
{
    if (!m_listInfo.contains(list)) {
        // decide whether this list is loose or tight
        ListInfo info;
        info.loose = false;
        if (list->count() > 1) {
            QTextBlock first = list->item(0);
            QTextBlock last = list->item(list->count() - 1);
            QTextBlock next = first.next();
            while (next.isValid()) {
                if (next == last)
                    break;
                qCDebug(lcMDW) << "next block in list" << list << next.text() << "part of list?" << next.textList();
                if (!next.textList()) {
                    // If we find a continuation paragraph, this list is "loose"
                    // because it will need a blank line to separate that paragraph.
                    qCDebug(lcMDW) << "decided list beginning with" << first.text() << "is loose after" << next.text();
                    info.loose = true;
                    break;
                }
                next = next.next();
            }
        }
        m_listInfo.insert(list, info);
        return info;
    }
    return m_listInfo.value(list);
}